

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id,ImGuiTreeNodeFlags flags)

{
  int iVar1;
  uint in_ESI;
  int in_EDI;
  ImGuiStorage *unaff_retaddr;
  int stored_value;
  bool is_open;
  ImGuiStorage *storage;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_29;
  ImGuiID key;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiID in_stack_fffffffffffffffc;
  
  if ((in_ESI & 0x100) == 0) {
    pIVar2 = GImGui->CurrentWindow;
    key = (ImGuiID)((ulong)pIVar2 >> 0x20);
    pIVar3 = GImGui;
    if (GImGui->NextTreeNodeOpenCond == 0) {
      iVar1 = ImGuiStorage::GetInt((ImGuiStorage *)GImGui,key,(int)pIVar2);
      local_29 = iVar1 != 0;
    }
    else {
      if ((GImGui->NextTreeNodeOpenCond & 1U) == 0) {
        iVar1 = ImGuiStorage::GetInt((ImGuiStorage *)GImGui,key,(int)pIVar2);
        if (iVar1 == -1) {
          local_29 = (bool)(pIVar3->NextTreeNodeOpenVal & 1);
          ImGuiStorage::SetInt(unaff_retaddr,in_stack_fffffffffffffffc,in_EDI);
        }
        else {
          local_29 = iVar1 != 0;
        }
      }
      else {
        local_29 = (bool)(GImGui->NextTreeNodeOpenVal & 1);
        ImGuiStorage::SetInt(unaff_retaddr,in_stack_fffffffffffffffc,in_EDI);
      }
      pIVar3->NextTreeNodeOpenCond = 0;
    }
    if ((((pIVar3->LogEnabled & 1U) != 0) && ((in_ESI & 0x10) == 0)) &&
       ((pIVar2->DC).TreeDepth < pIVar3->LogAutoExpandMaxDepth)) {
      local_29 = true;
    }
  }
  else {
    local_29 = true;
  }
  return local_29;
}

Assistant:

bool ImGui::TreeNodeBehaviorIsOpen(ImGuiID id, ImGuiTreeNodeFlags flags)
{
    if (flags & ImGuiTreeNodeFlags_Leaf)
        return true;

    // We only write to the tree storage if the user clicks (or explicitly use SetNextTreeNode*** functions)
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStorage* storage = window->DC.StateStorage;

    bool is_open;
    if (g.NextTreeNodeOpenCond != 0)
    {
        if (g.NextTreeNodeOpenCond & ImGuiCond_Always)
        {
            is_open = g.NextTreeNodeOpenVal;
            storage->SetInt(id, is_open);
        }
        else
        {
            // We treat ImGuiCond_Once and ImGuiCond_FirstUseEver the same because tree node state are not saved persistently.
            const int stored_value = storage->GetInt(id, -1);
            if (stored_value == -1)
            {
                is_open = g.NextTreeNodeOpenVal;
                storage->SetInt(id, is_open);
            }
            else
            {
                is_open = stored_value != 0;
            }
        }
        g.NextTreeNodeOpenCond = 0;
    }
    else
    {
        is_open = storage->GetInt(id, (flags & ImGuiTreeNodeFlags_DefaultOpen) ? 1 : 0) != 0;
    }

    // When logging is enabled, we automatically expand tree nodes (but *NOT* collapsing headers.. seems like sensible behavior).
    // NB- If we are above max depth we still allow manually opened nodes to be logged.
    if (g.LogEnabled && !(flags & ImGuiTreeNodeFlags_NoAutoOpenOnLog) && window->DC.TreeDepth < g.LogAutoExpandMaxDepth)
        is_open = true;

    return is_open;
}